

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

string * __thiscall
CGL::Application::info_abi_cxx11_(string *__return_storage_ptr__,Application *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (this->mode - RENDER_MODE < 2) {
    pcVar2 = "renderer";
    paVar1 = &local_a;
  }
  else if (this->mode == EDIT_MODE) {
    pcVar2 = "MeshEdit";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string Application::info() {
  switch (mode) {
    case EDIT_MODE:
      return "MeshEdit";
      break;
    case RENDER_MODE:
    case VISUALIZE_MODE:
      return "renderer";
      break;
  }
  return "";
}